

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

ITexture * __thiscall
irr::video::CNullDriver::addTexture(CNullDriver *this,path *name,IImage *image)

{
  code *pcVar1;
  _func_int *p_Var2;
  int iVar3;
  undefined4 extraout_var;
  double in_XMM0_Qa;
  SSurface s;
  SSurface local_18;
  ITexture *pIVar4;
  
  if ((int)(name->str)._M_string_length == 0) {
    os::Printer::log((Printer *)"Could not create ITexture, texture needs to have a non-empty name."
                     ,in_XMM0_Qa);
  }
  else if (image != (IImage *)0x0) {
    iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x75])();
    pIVar4 = (ITexture *)CONCAT44(extraout_var,iVar3);
    if (pIVar4 != (ITexture *)0x0) {
      *(int *)(pIVar4->_vptr_ITexture[-3] + 8 + (long)&(pIVar4->NamedPath).Path) =
           *(int *)(pIVar4->_vptr_ITexture[-3] + 8 + (long)&(pIVar4->NamedPath).Path) + 1;
      local_18.Surface = pIVar4;
      core::array<irr::video::CNullDriver::SSurface>::push_back
                ((array<irr::video::CNullDriver::SSurface> *)&(this->super_IVideoDriver).field_0x10,
                 &local_18);
      p_Var2 = pIVar4->_vptr_ITexture[-3];
      pcVar1 = p_Var2 + 8 + (long)&(pIVar4->NamedPath).Path;
      *(int *)pcVar1 = *(int *)pcVar1 + -1;
      if (*(int *)pcVar1 != 0) {
        return pIVar4;
      }
      (**(code **)(*(long *)((long)&pIVar4->_vptr_ITexture + (long)p_Var2) + 8))();
      return pIVar4;
    }
  }
  return (ITexture *)0x0;
}

Assistant:

ITexture *CNullDriver::addTexture(const io::path &name, IImage *image)
{
	if (0 == name.size()) {
		os::Printer::log("Could not create ITexture, texture needs to have a non-empty name.", ELL_WARNING);
		return 0;
	}

	if (!image)
		return 0;

	ITexture *t = 0;

	if (checkImage(image)) {
		t = createDeviceDependentTexture(name, image);
	}

	if (t) {
		addTexture(t);
		t->drop();
	}

	return t;
}